

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O1

pair<unsigned_long,_unsigned_long>
slang::ast::dynamicBitstreamSize(Type *type,BitstreamSizeMode mode)

{
  SymbolKind SVar1;
  pair<unsigned_long,_unsigned_long> pVar2;
  pair<unsigned_long,_unsigned_long> pVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  pair<unsigned_long,_unsigned_long> pVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  BitstreamSizeMode BVar8;
  bool bVar9;
  bitwidth_t bVar10;
  Type *pTVar12;
  int iVar11;
  specific_symbol_iterator<slang::ast::ClassPropertySymbol> sVar13;
  unsigned_long uVar14;
  int iVar15;
  char *func;
  ulong uVar16;
  _Ct __n2;
  _Ct __m2;
  specific_symbol_iterator<slang::ast::FieldSymbol> sVar17;
  pair<unsigned_long,_unsigned_long> pVar18;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::FieldSymbol>_> iVar19;
  iterator_range<slang::ast::Scope::specific_symbol_iterator<slang::ast::ClassPropertySymbol>_>
  iVar20;
  specific_symbol_iterator<slang::ast::FieldSymbol> local_38;
  unsigned_long __n;
  
  bVar10 = Type::getBitWidth(type);
  uVar16 = CONCAT44(0,bVar10);
  if (bVar10 == 0) {
    if (type->canonical == (Type *)0x0) {
      Type::resolveCanonical(type);
    }
    if ((type->canonical->super_Symbol).kind == StringType) {
      return (pair<unsigned_long,_unsigned_long>)(ZEXT116(mode != DestEmpty) << 3);
    }
    bVar9 = Type::isUnpackedArray(type);
    if (!bVar9) {
      if (type->canonical == (Type *)0x0) {
        Type::resolveCanonical(type);
      }
      SVar1 = (type->canonical->super_Symbol).kind;
      if (SVar1 == ClassType) {
        if ((type->canonical->super_Symbol).kind == ClassType) {
          iVar20 = Scope::membersOfType<slang::ast::ClassPropertySymbol>
                             ((Scope *)(type->canonical + 1));
          sVar13 = iVar20.m_begin.current;
          if (sVar13.current == iVar20.m_end.current.current) goto LAB_00215afa;
          uVar14 = 0;
          while ((sVar13.current)->kind == ClassProperty) {
            pTVar12 = DeclaredType::getType((DeclaredType *)(sVar13.current + 1));
            pVar18 = dynamicBitstreamSize(pTVar12,mode);
            uVar14 = std::__detail::__gcd<unsigned_long>(uVar14,pVar18.first);
            do {
              sVar13.current = (sVar13.current)->nextInScope;
              if (sVar13.current == (Symbol *)0x0) break;
            } while ((sVar13.current)->kind != ClassProperty);
            uVar16 = uVar16 + pVar18.second;
            pVar18.second = uVar16;
            pVar18.first = uVar14;
            if (sVar13.current == iVar20.m_end.current.current) {
              return pVar18;
            }
          }
          func = "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::ClassPropertySymbol]";
        }
        else {
          func = "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::ClassType]";
        }
      }
      else {
        if (SVar1 != UnpackedStructType) goto LAB_00215afa;
        iVar19 = Scope::membersOfType<slang::ast::FieldSymbol>((Scope *)(type->canonical + 1));
        uVar14 = 0;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = uVar16;
        if (iVar19.m_begin.current.current == iVar19.m_end.current.current) {
          return (pair<unsigned_long,_unsigned_long>)(auVar7 << 0x40);
        }
        while( true ) {
          local_38 = iVar19.m_end.current;
          sVar17 = iVar19.m_begin.current;
          if ((sVar17.current)->kind != Field) break;
          pTVar12 = DeclaredType::getType((DeclaredType *)(sVar17.current + 1));
          pVar18 = dynamicBitstreamSize(pTVar12,mode);
          BVar8 = (pVar18.first == 0) + DestEmpty;
          if (mode != DestFill) {
            BVar8 = mode;
          }
          mode = BVar8;
          uVar14 = std::__detail::__gcd<unsigned_long>(uVar14,pVar18.first);
          do {
            sVar17.current = (sVar17.current)->nextInScope;
            iVar19.m_end.current = local_38.current;
            iVar19.m_begin.current = sVar17.current;
            if (sVar17.current == (Symbol *)0x0) break;
          } while ((sVar17.current)->kind != Field);
          uVar16 = uVar16 + pVar18.second;
          pVar5.second = uVar16;
          pVar5.first = uVar14;
          if (sVar17.current == local_38.current) {
            return pVar5;
          }
        }
        func = "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::FieldSymbol]";
      }
      assert::assertFailed
                ("T::isKind(kind)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                 ,0xc4,func);
    }
    pTVar12 = Type::getArrayElementType(type);
    pVar18 = dynamicBitstreamSize(pTVar12,mode);
    __n = pVar18.second;
    pVar2.second = 0;
    pVar2.first = __n;
    uVar14 = pVar18.first;
    if (type->canonical == (Type *)0x0) {
      Type::resolveCanonical(type);
    }
    pTVar12 = type->canonical;
    if ((pTVar12->super_Symbol).kind == FixedSizeUnpackedArrayType) {
      iVar15 = (int)pTVar12[1].super_Symbol.name._M_len -
               *(int *)((long)&pTVar12[1].super_Symbol.name._M_len + 4);
      iVar11 = -iVar15;
      if (0 < iVar15) {
        iVar11 = iVar15;
      }
      pVar3.second = __n * (iVar11 + 1);
      pVar3.first = uVar14 * (iVar11 + 1);
      return pVar3;
    }
    if (mode == Source) {
      uVar14 = std::__detail::__gcd<unsigned_long>(uVar14,__n);
      pVar4.second = 0;
      pVar4.first = uVar14;
      return pVar4;
    }
    if (mode == DestFill) {
      if (uVar14 == 0) {
        return pVar2;
      }
      return pVar18;
    }
  }
LAB_00215afa:
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar16;
  return (pair<unsigned_long,_unsigned_long>)(auVar6 << 0x40);
}

Assistant:

static std::pair<size_t, size_t> dynamicBitstreamSize(const Type& type, BitstreamSizeMode mode) {
    size_t fixedSize = type.getBitWidth();
    if (fixedSize > 0)
        return {0, fixedSize};

    if (type.isString())
        return {mode == BitstreamSizeMode::DestEmpty ? 0 : CHAR_BIT, 0};

    // TODO: check for overflow
    size_t multiplier = 0;
    if (type.isUnpackedArray()) {
        auto [multiplierElem, fixedSizeElem] = dynamicBitstreamSize(*type.getArrayElementType(),
                                                                    mode);

        const auto& ct = type.getCanonicalType();
        if (ct.kind == SymbolKind::FixedSizeUnpackedArrayType) {
            auto rw = ct.as<FixedSizeUnpackedArrayType>().range.width();
            multiplier = multiplierElem * rw;
            fixedSize = fixedSizeElem * rw;
        }
        else if (mode == BitstreamSizeMode::DestFill) {
            if (!multiplierElem)
                multiplier = fixedSizeElem; // element is fixed size
            else {
                multiplier = multiplierElem; // element is dynamically sized
                fixedSize = fixedSizeElem;
            }
        }
        else if (mode == BitstreamSizeMode::Source) {
            multiplier = std::gcd(multiplierElem, fixedSizeElem);
        }
    }
    else if (type.isUnpackedStruct()) {
        auto& us = type.getCanonicalType().as<UnpackedStructType>();
        for (auto& field : us.membersOfType<FieldSymbol>()) {
            auto [multiplierElem, fixedSizeElem] = dynamicBitstreamSize(field.getType(), mode);
            if (mode == BitstreamSizeMode::DestFill && multiplierElem > 0) {
                // dynamically sized field filled and rest should be empty
                mode = BitstreamSizeMode::DestEmpty;
            }

            multiplier = std::gcd(multiplier, multiplierElem);
            fixedSize += fixedSizeElem;
        }
    }
    else if (type.isClass()) {
        auto& ct = type.getCanonicalType().as<ClassType>();
        for (auto& prop : ct.membersOfType<ClassPropertySymbol>()) {
            auto [multiplierElem, fixedSizeElem] = dynamicBitstreamSize(prop.getType(), mode);
            multiplier = std::gcd(multiplier, multiplierElem);
            fixedSize += fixedSizeElem;
        }
    }

    return {multiplier, fixedSize};
}